

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_test_helper.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::pixie::PriceMapEvent::GetPriceString_abi_cxx11_
          (string *__return_storage_ptr__,PriceMapEvent *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  std::operator<<(local_1a8,"{");
  for (p_Var2 = (this->price_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->price_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(local_1a8,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,"=");
    poVar1 = (ostream *)bidfx_public_api::price::operator<<(poVar1,(PriceField *)(p_Var2 + 2));
    std::operator<<(poVar1,", ");
  }
  std::operator<<(local_1a8,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string PriceMapEvent::GetPriceString()
{
    std::stringstream ss;
    ss << "{";
    for (auto it = price_.cbegin(); it != price_.cend(); it++)
    {
        ss << (it->first) << "=" << (it->second) << ", ";
    }
    ss << "}";
    return ss.str();
}